

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

void sam_hdr_dump(SAM_hdr *hdr)

{
  ushort uVar1;
  kh_sam_hdr_t *pkVar2;
  SAM_hdr_type *pSVar3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  SAM_hdr_tag *pSVar7;
  ulong uVar8;
  SAM_hdr_item_s *pSVar9;
  char c [2];
  
  puts("===DUMP===");
  for (uVar8 = 0; pkVar2 = hdr->h, (khint_t)uVar8 != pkVar2->n_buckets;
      uVar8 = (ulong)((khint_t)uVar8 + 1)) {
    if ((pkVar2->flags[uVar8 >> 4] >> ((char)uVar8 * '\x02' & 0x1fU) & 3) == 0) {
      pSVar3 = pkVar2->vals[uVar8];
      uVar1 = (ushort)pkVar2->keys[uVar8];
      c = (char  [2])(uVar1 << 8 | uVar1 >> 8);
      printf("Type %.2s, count %d\n",c,(ulong)(pSVar3->prev->order + 1));
      pSVar9 = pSVar3;
      do {
        printf(">>>%d ",(ulong)(uint)pSVar9->order);
        pSVar7 = (SAM_hdr_tag *)&pSVar9->tag;
        while (pSVar7 = pSVar7->next, pSVar7 != (SAM_hdr_tag *)0x0) {
          printf("\"%.2s\":\"%.*s\"\t",pSVar7->str,(ulong)(pSVar7->len - 3),pSVar7->str + 3);
        }
        putchar(10);
        pSVar9 = pSVar9->next;
      } while (pSVar9 != pSVar3);
    }
  }
  puts("\n@PG chains:");
  for (uVar8 = 0; (long)uVar8 < (long)hdr->npg_end; uVar8 = uVar8 + 1) {
    printf("  %d:",uVar8 & 0xffffffff);
    piVar4 = hdr->pg_end + uVar8;
    while( true ) {
      lVar5 = (long)*piVar4;
      if (lVar5 == -1) break;
      pcVar6 = "->";
      if (*piVar4 == hdr->pg_end[uVar8]) {
        pcVar6 = " ";
      }
      printf("%s%d(%.*s)",pcVar6,lVar5,(ulong)(uint)hdr->pg[lVar5].name_len,hdr->pg[lVar5].name);
      piVar4 = &hdr->pg[lVar5].prev_id;
    }
    putchar(10);
  }
  puts("===END DUMP===");
  return;
}

Assistant:

void sam_hdr_dump(SAM_hdr *hdr) {
    khint_t k;
    int i;

    printf("===DUMP===\n");
    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;
	char c[2];

	if (!kh_exist(hdr->h, k))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	c[0] = kh_key(hdr->h, k)>>8;
	c[1] = kh_key(hdr->h, k)&0xff;
	printf("Type %.2s, count %d\n", c, t1->prev->order+1);

	do {
	    SAM_hdr_tag *tag;
	    printf(">>>%d ", t1->order);
	    for (tag = t1->tag; tag; tag=tag->next) {
		printf("\"%.2s\":\"%.*s\"\t",
		       tag->str, tag->len-3, tag->str+3);
	    }
	    putchar('\n');
	    t1 = t1->next;
	} while (t1 != t2);
    }

    /* Dump out PG chains */
    printf("\n@PG chains:\n");
    for (i = 0; i < hdr->npg_end; i++) {
	int j;
	printf("  %d:", i);
	for (j = hdr->pg_end[i]; j != -1; j = hdr->pg[j].prev_id) {
	    printf("%s%d(%.*s)", 
		   j == hdr->pg_end[i] ? " " : "->",
		   j, hdr->pg[j].name_len, hdr->pg[j].name);
	}
	printf("\n");
    }

    puts("===END DUMP===");
}